

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

ComponentData * __thiscall
HighsSymmetryDetection::computeComponentData
          (ComponentData *__return_storage_ptr__,HighsSymmetryDetection *this,
          HighsSymmetries *symmetries)

{
  vector<int,_std::allocator<int>_> *this_00;
  HighsInt *__args;
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  pdqsort_detail *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  iterator iVar5;
  bool bVar6;
  int iVar7;
  HighsInt HVar8;
  ulong uVar9;
  int iVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  HighsSymmetryDetection *pHVar11;
  long lVar12;
  uint uVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  long lVar15;
  anon_class_16_2_164db4ee comp;
  HighsInt numUsedPerms;
  HighsInt currentComponent;
  HighsInt currentComponentStart;
  HighsHashTable<int,_void> currComponentOrbits;
  undefined1 in_stack_ffffffffffffff68;
  uint local_94;
  int local_90;
  int local_8c;
  ComponentData *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  vector<int,std::allocator<int>> *local_70;
  vector<int,std::allocator<int>> *local_68;
  HighsSymmetries *local_60;
  HighsHashTable<int,_void> local_58;
  
  memset(__return_storage_ptr__,0,0x108);
  local_88 = __return_storage_ptr__;
  HighsDisjointSets<false>::reset(&__return_storage_ptr__->components,this->numActiveCols);
  local_80 = &__return_storage_ptr__->firstUnfixed;
  local_58.entries._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (local_80,(long)symmetries->numPerms,(value_type_conflict2 *)&local_58);
  this_00 = &__return_storage_ptr__->numUnfixed;
  local_58.entries._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (this_00,(long)symmetries->numPerms,(value_type_conflict2 *)&local_58);
  __args = &this->numActiveCols;
  iVar10 = symmetries->numPerms;
  uVar13 = *__args;
  uVar9 = (ulong)uVar13;
  if (0 < iVar10) {
    lVar15 = 0;
    local_60 = symmetries;
    do {
      iVar7 = (int)uVar9;
      if (0 < iVar7) {
        piVar2 = (symmetries->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = 0;
        do {
          iVar10 = piVar2[iVar7 * (int)lVar15 + lVar12];
          if (iVar10 != (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar12]) {
            HVar8 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar10];
            piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar15;
            *piVar1 = *piVar1 + 1;
            piVar3 = (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar10 = piVar3[lVar15];
            if (iVar10 == -1) {
              piVar3[lVar15] = HVar8;
            }
            else {
              HighsDisjointSets<false>::merge(&local_88->components,iVar10,HVar8);
            }
          }
          lVar12 = lVar12 + 1;
          uVar9 = (ulong)*__args;
        } while (lVar12 < (long)uVar9);
        iVar10 = local_60->numPerms;
        __return_storage_ptr__ = local_88;
        symmetries = local_60;
      }
      uVar13 = (uint)uVar9;
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar10);
  }
  piVar2 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 0x60),piVar2,
             piVar2 + (int)uVar13);
  this_01 = *(pdqsort_detail **)((long)__return_storage_ptr__ + 0x60);
  _Var4._M_current = *(int **)((long)__return_storage_ptr__ + 0x68);
  if (this_01 != (pdqsort_detail *)_Var4._M_current) {
    uVar9 = (long)_Var4._M_current - (long)this_01 >> 2;
    pHVar11 = (HighsSymmetryDetection *)0x0;
    if (1 < uVar9) {
      pHVar11 = (HighsSymmetryDetection *)0x0;
      do {
        uVar9 = (long)uVar9 >> 1;
        pHVar11 = (HighsSymmetryDetection *)(ulong)((int)pHVar11 + 1);
      } while (1 < uVar9);
    }
    comp.this = pHVar11;
    comp.componentData = (ComponentData *)this;
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0,false>
              (this_01,_Var4,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __return_storage_ptr__,comp,1,(bool)in_stack_ffffffffffffff68);
  }
  local_8c = -1;
  local_90 = -1;
  HighsHashTable<int,_void>::HighsHashTable(&local_58);
  if (0 < *__args) {
    local_68 = (vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 0x48);
    local_70 = (vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 0x90);
    local_78 = (vector<int,_std::allocator<int>_> *)((long)__return_storage_ptr__ + 0x78);
    lVar15 = 0;
    do {
      HVar8 = HighsDisjointSets<false>::getSet
                        (&__return_storage_ptr__->components,
                         (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [*(int *)(*(long *)((long)__return_storage_ptr__ + 0x60) + lVar15 * 4)]);
      if (*(int *)(*(long *)__return_storage_ptr__ + (long)HVar8 * 4) == 1) break;
      if (HVar8 != local_90) {
        local_8c = (int)lVar15;
        iVar5._M_current = *(int **)((long)__return_storage_ptr__ + 0x50);
        local_90 = HVar8;
        if (iVar5._M_current == *(int **)((long)__return_storage_ptr__ + 0x58)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_68,iVar5,&local_8c);
        }
        else {
          *iVar5._M_current = local_8c;
          *(int **)((long)__return_storage_ptr__ + 0x50) = iVar5._M_current + 1;
        }
        iVar5._M_current = *(int **)((long)__return_storage_ptr__ + 0x98);
        if (iVar5._M_current == *(int **)((long)__return_storage_ptr__ + 0xa0)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_70,iVar5,&local_90);
        }
        else {
          *iVar5._M_current = local_90;
          *(int **)((long)__return_storage_ptr__ + 0x98) = iVar5._M_current + 1;
        }
        iVar5._M_current = *(int **)((long)__return_storage_ptr__ + 0x80);
        if (iVar5._M_current == *(int **)((long)__return_storage_ptr__ + 0x88)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<>(local_78,iVar5);
        }
        else {
          *iVar5._M_current = 0;
          *(int **)((long)__return_storage_ptr__ + 0x80) = iVar5._M_current + 1;
        }
        HighsHashTable<int,_void>::clear(&local_58);
      }
      local_94 = getOrbit(this,*(HighsInt *)
                                (*(long *)((long)__return_storage_ptr__ + 0x60) + lVar15 * 4));
      bVar6 = HighsHashTable<int,_void>::insert<int>(&local_58,(int *)&local_94);
      if (bVar6) {
        *(int *)(*(long *)((long)__return_storage_ptr__ + 0x80) + -4) =
             *(int *)(*(long *)((long)__return_storage_ptr__ + 0x80) + -4) + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < *__args);
  }
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)((long)__return_storage_ptr__ + 0xc0),
             (long)symmetries->numPerms);
  local_94 = 0;
  if (0 < symmetries->numPerms) {
    do {
      if ((local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[(int)local_94] != -1) {
        iVar5._M_current = *(int **)((long)__return_storage_ptr__ + 200);
        if (iVar5._M_current == *(int **)((long)__return_storage_ptr__ + 0xd0)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 0xc0),iVar5,
                     (int *)&local_94);
        }
        else {
          *iVar5._M_current = local_94;
          *(int **)((long)__return_storage_ptr__ + 200) = iVar5._M_current + 1;
        }
      }
      local_94 = local_94 + 1;
    } while ((int)local_94 < symmetries->numPerms);
  }
  begin._M_current = *(int **)((long)__return_storage_ptr__ + 0xc0);
  _Var4._M_current = *(int **)((long)__return_storage_ptr__ + 200);
  _Var14._M_current = begin._M_current;
  if (begin._M_current != _Var4._M_current) {
    uVar9 = (long)_Var4._M_current - (long)begin._M_current >> 2;
    iVar10 = 0;
    if (1 < uVar9) {
      iVar10 = 0;
      do {
        uVar9 = (long)uVar9 >> 1;
        iVar10 = iVar10 + 1;
      } while (1 < uVar9);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1,false>
              (begin,_Var4,(anon_class_8_1_56ae1867)__return_storage_ptr__,iVar10,true);
    begin._M_current = *(int **)((long)__return_storage_ptr__ + 0xc0);
    _Var14._M_current = *(int **)((long)__return_storage_ptr__ + 200);
  }
  local_8c = -1;
  local_90 = -1;
  uVar13 = (uint)((ulong)((long)_Var14._M_current - (long)begin._M_current) >> 2);
  local_94 = uVar13;
  if (0 < (int)uVar13) {
    uVar9 = 0;
    do {
      HVar8 = HighsDisjointSets<false>::getSet
                        (&__return_storage_ptr__->components,
                         *(HighsInt *)
                          (*(long *)((long)__return_storage_ptr__ + 0xd8) +
                          (long)*(int *)(*(long *)((long)__return_storage_ptr__ + 0xc0) + uVar9 * 4)
                          * 4));
      if (HVar8 != local_90) {
        local_8c = (int)uVar9;
        iVar5._M_current = *(int **)((long)__return_storage_ptr__ + 0xb0);
        local_90 = HVar8;
        if (iVar5._M_current == *(int **)((long)__return_storage_ptr__ + 0xb8)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 0xa8),iVar5,
                     &local_8c);
        }
        else {
          *iVar5._M_current = local_8c;
          *(int **)((long)__return_storage_ptr__ + 0xb0) = iVar5._M_current + 1;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (uVar13 & 0x7fffffff));
  }
  iVar5._M_current = *(int **)((long)__return_storage_ptr__ + 0xb0);
  if (iVar5._M_current == *(int **)((long)__return_storage_ptr__ + 0xb8)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 0xa8),iVar5,
               (int *)&local_94);
  }
  else {
    *iVar5._M_current = uVar13;
    *(int **)((long)__return_storage_ptr__ + 0xb0) = iVar5._M_current + 1;
  }
  iVar5._M_current = *(int **)((long)__return_storage_ptr__ + 0x50);
  if (iVar5._M_current == *(int **)((long)__return_storage_ptr__ + 0x58)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 0x48),iVar5,__args
              );
  }
  else {
    *iVar5._M_current = *__args;
    *(int **)((long)__return_storage_ptr__ + 0x50) = iVar5._M_current + 1;
  }
  HighsHashTable<int,_void>::~HighsHashTable(&local_58);
  return __return_storage_ptr__;
}

Assistant:

HighsSymmetryDetection::ComponentData
HighsSymmetryDetection::computeComponentData(
    const HighsSymmetries& symmetries) {
  ComponentData componentData;

  componentData.components.reset(numActiveCols);
  componentData.firstUnfixed.assign(symmetries.numPerms, -1);
  componentData.numUnfixed.assign(symmetries.numPerms, 0);
  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    const HighsInt* perm = symmetries.permutations.data() + i * numActiveCols;

    for (HighsInt j = 0; j < numActiveCols; ++j) {
      if (perm[j] != vertexGroundSet[j]) {
        HighsInt pos = vertexPosition[perm[j]];
        componentData.numUnfixed[i] += 1;
        if (componentData.firstUnfixed[i] != -1)
          componentData.components.merge(componentData.firstUnfixed[i], pos);
        else
          componentData.firstUnfixed[i] = pos;
      }
    }
  }

  componentData.componentSets.assign(vertexGroundSet.begin(),
                                     vertexGroundSet.begin() + numActiveCols);
  pdqsort(componentData.componentSets.begin(),
          componentData.componentSets.end(), [&](HighsInt u, HighsInt v) {
            HighsInt uComp = componentData.components.getSet(vertexPosition[u]);
            HighsInt vComp = componentData.components.getSet(vertexPosition[v]);
            return std::make_pair(
                       componentData.components.getSetSize(uComp) == 1, uComp) <
                   std::make_pair(
                       componentData.components.getSetSize(vComp) == 1, vComp);
          });

  HighsInt currentComponentStart = -1;
  HighsInt currentComponent = -1;
  HighsHashTable<HighsInt> currComponentOrbits;
  for (HighsInt i = 0; i < numActiveCols; ++i) {
    HighsInt comp = componentData.components.getSet(
        vertexPosition[componentData.componentSets[i]]);
    if (componentData.components.getSetSize(comp) == 1) break;
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.componentStarts.push_back(currentComponentStart);
      componentData.componentNumber.push_back(currentComponent);
      componentData.componentNumOrbits.emplace_back();
      currComponentOrbits.clear();
    }

    if (currComponentOrbits.insert(getOrbit(componentData.componentSets[i]))) {
      ++componentData.componentNumOrbits.back();
    }
  }

  componentData.permComponents.reserve(symmetries.numPerms);

  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    if (componentData.firstUnfixed[i] == -1) continue;
    componentData.permComponents.push_back(i);
  }

  pdqsort(componentData.permComponents.begin(),
          componentData.permComponents.end(), [&](HighsInt i, HighsInt j) {
            HighsInt seti =
                componentData.components.getSet(componentData.firstUnfixed[i]);
            HighsInt setj =
                componentData.components.getSet(componentData.firstUnfixed[j]);
            return std::make_pair(seti, componentData.numUnfixed[i]) <
                   std::make_pair(setj, componentData.numUnfixed[j]);
          });

  currentComponentStart = -1;
  currentComponent = -1;

  HighsInt numUsedPerms = componentData.permComponents.size();

  for (HighsInt i = 0; i < numUsedPerms; ++i) {
    HighsInt p = componentData.permComponents[i];
    HighsInt comp =
        componentData.components.getSet(componentData.firstUnfixed[p]);
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.permComponentStarts.push_back(currentComponentStart);
    }
  }

  assert(componentData.permComponentStarts.size() ==
         componentData.componentStarts.size());
  componentData.permComponentStarts.push_back(numUsedPerms);

  // HighsInt numComponents = componentData.componentStarts.size();
  // printf("found %d components\n", numComponents);
  componentData.componentStarts.push_back(numActiveCols);

  return componentData;
}